

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# threadsusp.cpp
# Opt level: O0

PAL_ERROR __thiscall
CorUnix::CThreadSuspensionInfo::InternalResumeThreadFromData
          (CThreadSuspensionInfo *this,CPalThread *pthrResumer,CPalThread *pthrTarget,
          DWORD *pdwSuspendCount)

{
  uint uVar1;
  FILE *__stream;
  PalThreadType PVar2;
  THREAD_STATE TVar3;
  BOOL BVar4;
  int iVar5;
  ssize_t sVar6;
  int *piVar7;
  uint *puVar8;
  char *pcVar9;
  PAL_ERROR local_2c;
  int nWrittenBytes;
  PAL_ERROR palError;
  DWORD *pdwSuspendCount_local;
  CPalThread *pthrTarget_local;
  CPalThread *pthrResumer_local;
  CThreadSuspensionInfo *this_local;
  
  local_2c = 0;
  PVar2 = CPalThread::GetThreadType(pthrTarget);
  if (PVar2 == SignalHandlerThread) {
    fprintf(_stderr,"] %s %s:%d","InternalResumeThreadFromData",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/thread/threadsusp.cpp"
            ,0xf7);
    fprintf(_stderr,
            "Attempting to resume the signal handling thread, which can never be suspended.\n");
    local_2c = 6;
  }
  else {
    AcquireSuspensionLocks(this,pthrResumer,pthrTarget);
    TVar3 = CThreadSynchronizationInfo::GetThreadState(&pthrTarget->synchronizationInfo);
    if (TVar3 == TS_DONE) {
      local_2c = 6;
      ReleaseSuspensionLocks(this,pthrResumer,pthrTarget);
    }
    else {
      BVar4 = CPalThread::IsDummy(pthrTarget);
      if ((BVar4 == 0) || (iVar5 = GetBlockingPipe(&pthrTarget->suspensionInfo), iVar5 != -1)) {
        iVar5 = GetBlockingPipe(&pthrTarget->suspensionInfo);
        if (iVar5 == -1) {
          *pdwSuspendCount = 0;
          local_2c = 0x16;
        }
        else {
          while( true ) {
            iVar5 = GetBlockingPipe(&pthrTarget->suspensionInfo);
            sVar6 = write(iVar5,"*N7CorUnix21CThreadSuspensionInfoE",1);
            iVar5 = (int)sVar6;
            if (iVar5 == 1) {
              SetBlockingPipe(&pthrTarget->suspensionInfo,-1);
              ReleaseSuspensionLocks(this,pthrResumer,pthrTarget);
              goto LAB_00171a0a;
            }
            if ((iVar5 == -1) && (piVar7 = __errno_location(), *piVar7 == 0x20)) {
              local_2c = 6;
              ReleaseSuspensionLocks(this,pthrResumer,pthrTarget);
              if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
                abort();
              }
              goto LAB_00171a0a;
            }
            if ((iVar5 != 0) && ((iVar5 != -1 || (piVar7 = __errno_location(), *piVar7 != 4))))
            break;
            if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
              abort();
            }
          }
          local_2c = 0x54f;
          ReleaseSuspensionLocks(this,pthrResumer,pthrTarget);
          fprintf(_stderr,"] %s %s:%d","InternalResumeThreadFromData",
                  "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/thread/threadsusp.cpp"
                  ,0x133);
          __stream = _stderr;
          puVar8 = (uint *)__errno_location();
          uVar1 = *puVar8;
          piVar7 = __errno_location();
          pcVar9 = strerror(*piVar7);
          fprintf(__stream,"Write() failed; error is %d (%s)\n",(ulong)uVar1,pcVar9);
        }
      }
      else {
        local_2c = 6;
        if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
          abort();
        }
        ReleaseSuspensionLocks(this,pthrResumer,pthrTarget);
      }
    }
  }
LAB_00171a0a:
  if (local_2c == 0) {
    *pdwSuspendCount = 1;
  }
  return local_2c;
}

Assistant:

PAL_ERROR
CThreadSuspensionInfo::InternalResumeThreadFromData(
    CPalThread *pthrResumer,
    CPalThread *pthrTarget,
    DWORD *pdwSuspendCount
    )
{
    PAL_ERROR palError = NO_ERROR;

    int nWrittenBytes = -1;

    if (SignalHandlerThread == pthrTarget->GetThreadType())
    {
        ASSERT("Attempting to resume the signal handling thread, which can never be suspended.\n");
        palError = ERROR_INVALID_HANDLE;
        goto InternalResumeThreadFromDataExit;
    }

    // Acquire suspension mutex
    AcquireSuspensionLocks(pthrResumer, pthrTarget);

    // Check target thread's state to ensure it hasn't died.
    // Setting a thread's state to TS_DONE is protected by the
    // target's suspension mutex.
    if (pthrTarget->synchronizationInfo.GetThreadState() == TS_DONE)
    {
        palError = ERROR_INVALID_HANDLE;
        ReleaseSuspensionLocks(pthrResumer, pthrTarget);
        goto InternalResumeThreadFromDataExit;
    }

    // If this is a dummy thread, then it represents a process that was created with CREATE_SUSPENDED
    // and it should have a blocking pipe set. If GetBlockingPipe returns -1 for a dummy thread, then
    // something is wrong - either CREATE_SUSPENDED wasn't used or the process was already resumed.
    if (pthrTarget->IsDummy() && -1 == pthrTarget->suspensionInfo.GetBlockingPipe())
    {
        palError = ERROR_INVALID_HANDLE;
        ERROR("Tried to wake up dummy thread without a blocking pipe.\n");
        ReleaseSuspensionLocks(pthrResumer, pthrTarget);
        goto InternalResumeThreadFromDataExit;
    }

    // If there is a blocking pipe on this thread, resume it by writing the wake up code to that pipe.
    if (-1 != pthrTarget->suspensionInfo.GetBlockingPipe())
    {
        // If write() is interrupted by a signal before writing data,
        // it returns -1 and sets errno to EINTR. In this case, we
        // attempt the write() again.
        writeAgain:
        nWrittenBytes = write(pthrTarget->suspensionInfo.GetBlockingPipe(), &WAKEUPCODE, sizeof(WAKEUPCODE));

        // The size of WAKEUPCODE is 1 byte. If write returns 0, we'll treat it as an error.
        if (sizeof(WAKEUPCODE) != nWrittenBytes)
        {
            // If we are here during process creation, this is most likely caused by the target
            // process dying before reaching this point and thus breaking the pipe.
            if (nWrittenBytes == -1 && EPIPE == errno)
            {
                palError = ERROR_INVALID_HANDLE;
                ReleaseSuspensionLocks(pthrResumer, pthrTarget);
                ERROR("Write failed with EPIPE\n");
                goto InternalResumeThreadFromDataExit;
            }
            else if (nWrittenBytes == 0 || (nWrittenBytes == -1 && EINTR == errno))
            {
                TRACE("write() failed with EINTR; re-attempting write\n");
                goto writeAgain;
            }
            else
            {
                // Some other error occurred; need to release suspension mutexes before leaving ResumeThread.
                palError = ERROR_INTERNAL_ERROR;
                ReleaseSuspensionLocks(pthrResumer, pthrTarget);
                ASSERT("Write() failed; error is %d (%s)\n", errno, strerror(errno));
                goto InternalResumeThreadFromDataExit;
            }
        }

        // Reset blocking pipe to -1 since we're done using it.
        pthrTarget->suspensionInfo.SetBlockingPipe(-1);

        ReleaseSuspensionLocks(pthrResumer, pthrTarget);
        goto InternalResumeThreadFromDataExit;
    }
    else
    {
        *pdwSuspendCount = 0;
        palError = ERROR_BAD_COMMAND;
    }

InternalResumeThreadFromDataExit:

    if (NO_ERROR == palError)
    {
        *pdwSuspendCount = 1;
    }

    return palError;
}